

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O0

int render_glyph(ALLEGRO_FONT *f,ALLEGRO_COLOR color,int prev_ft_index,int ft_index,int32_t prev_ch,
                int32_t ch,float xpos,float ypos)

{
  _Bool _Var1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  float in_XMM2_Da;
  float in_XMM3_Da;
  ALLEGRO_GLYPH glyph;
  undefined8 local_60;
  undefined4 local_58;
  undefined4 local_54;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  _Var1 = ttf_get_glyph_worker
                    ((ALLEGRO_FONT *)CONCAT44(in_XMM2_Da,in_XMM3_Da),in_stack_ffffffffffffffc4,
                     in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                     (ALLEGRO_GLYPH *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
  ;
  if (_Var1) {
    local_4 = in_stack_ffffffffffffffc4;
    if (local_60 != 0) {
      al_draw_tinted_bitmap_region
                (in_XMM0_Qa,in_XMM1_Qa,(float)local_58,(float)local_54,
                 (float)in_stack_ffffffffffffffb0,(float)in_stack_ffffffffffffffb4,
                 in_XMM2_Da + (float)in_stack_ffffffffffffffbc + (float)in_stack_ffffffffffffffb8,
                 in_XMM3_Da + (float)in_stack_ffffffffffffffc0,local_60,0);
      local_4 = in_stack_ffffffffffffffc4;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int render_glyph(ALLEGRO_FONT const *f, ALLEGRO_COLOR color,
   int prev_ft_index, int ft_index, int32_t prev_ch, int32_t ch, float xpos, float ypos)
{
   ALLEGRO_GLYPH glyph;

   if (ttf_get_glyph_worker(f, prev_ft_index, ft_index, prev_ch, ch, &glyph) == false)
      return 0;

   if (glyph.bitmap != NULL) {
      al_draw_tinted_bitmap_region(
         glyph.bitmap, color,
         glyph.x, glyph.y, glyph.w, glyph.h,
         xpos + glyph.offset_x + glyph.kerning,
         ypos + glyph.offset_y,
         0
      );
   }

   return glyph.advance;
}